

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::SetCommissionerDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,CommissionerDataset *aDataset)

{
  anon_class_128_3_2539074c local_c0;
  AsyncRequest local_40;
  CommissionerDataset *local_20;
  CommissionerDataset *aDataset_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_c0.this = this;
  local_20 = aDataset;
  aDataset_local = (CommissionerDataset *)aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_c0.aHandler,aHandler);
  CommissionerDataset::CommissionerDataset(&local_c0.aDataset,local_20);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::SetCommissionerDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::CommissionerDataset_const&)::__0,void>
            ((function<void()> *)&local_40,&local_c0);
  PushAsyncRequest(this,&local_40);
  std::function<void_()>::~function(&local_40);
  SetCommissionerDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::CommissionerDataset_const&)
  ::$_0::~__0((__0 *)&local_c0);
  return;
}

Assistant:

void CommissionerSafe::SetCommissionerDataset(ErrorHandler aHandler, const CommissionerDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetCommissionerDataset(aHandler, aDataset); });
}